

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpInputStream::Response> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::readResponse
          (HttpInputStreamImpl *this,HttpMethod requestMethod)

{
  TransformPromiseNodeBase *this_00;
  undefined4 in_EDX;
  PromiseNode *extraout_RDX;
  undefined4 in_register_00000034;
  Promise<kj::HttpInputStream::Response> PVar1;
  undefined1 local_50 [24];
  size_t local_38;
  Own<kj::_::PromiseNode> local_30;
  
  readResponseHeaders((HttpInputStreamImpl *)local_50);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_50,
             _::
             TransformPromiseNode<kj::HttpInputStream::Response,_kj::Maybe<kj::HttpHeaders::Response>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1025:15),_kj::_::PropagateException>
             ::anon_class_16_2_b11f703d_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00428680;
  this_00[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)CONCAT44(in_register_00000034,requestMethod);
  *(undefined4 *)&this_00[1].dependency.disposer = in_EDX;
  local_50._16_8_ =
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpInputStream::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpInputStreamImpl::readResponse(kj::HttpMethod)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_30.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpInputStream::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpInputStreamImpl::readResponse(kj::HttpMethod)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_38 = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpInputStream::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpInputStreamImpl::readResponse(kj::HttpMethod)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  this->inner = (AsyncInputStream *)this_00;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_50 + 0x10));
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_50);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpInputStream::Response>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<Response> readResponse(HttpMethod requestMethod) override {
    return readResponseHeaders()
        .then([this,requestMethod](kj::Maybe<HttpHeaders::Response>&& maybeResponse)
              -> HttpInputStream::Response {
      auto response = KJ_REQUIRE_NONNULL(maybeResponse, "bad response");
      auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, requestMethod, 0, headers);

      return { response.statusCode, response.statusText, headers, kj::mv(body) };
    });
  }